

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

int __thiscall Saturation::SaturationAlgorithm::init(SaturationAlgorithm *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  Clause *cl;
  Stack<Kernel::Clause_*> aux;
  ClauseIterator toAdd;
  Clause *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  SaturationAlgorithm *in_stack_ffffffffffffff50;
  Problem *in_stack_ffffffffffffff68;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>
  *in_stack_ffffffffffffffa8;
  Stack<Kernel::Clause_*> local_40;
  VirtualIterator<Kernel::Clause_*> local_10;
  SaturationAlgorithm *local_8;
  
  local_8 = this;
  Lib::VirtualIterator<Kernel::Clause_*>::VirtualIterator(&local_10);
  bVar1 = Shell::Options::randomTraversals(Lib::env);
  if (bVar1) {
    Lib::Stack<Kernel::Clause_*>::Stack
              ((Stack<Kernel::Clause_*> *)in_stack_ffffffffffffff50,
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Kernel::Problem::clauseIterator(in_stack_ffffffffffffff68);
    Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
              ((Stack<Kernel::Clause_*> *)in_stack_ffffffffffffff50,
               (VirtualIterator<Kernel::Clause_*> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff50 = (SaturationAlgorithm *)Lib::Stack<Kernel::Clause_*>::size(&local_40)
    ;
    Shell::Shuffling::shuffleArray<Lib::Stack<Kernel::Clause*>>
              ((Stack<Kernel::Clause_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    Lib::arrayIter<Lib::Stack<Kernel::Clause*>>
              ((Stack<Kernel::Clause_*> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Lib::
    pvi<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>>
              (in_stack_ffffffffffffffa8);
    Lib::VirtualIterator<Kernel::Clause_*>::operator=
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffff50,
               (VirtualIterator<Kernel::Clause_*> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffff40);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>
    ::~IterTraits((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>
                   *)0xad0591);
    Lib::Stack<Kernel::Clause_*>::~Stack((Stack<Kernel::Clause_*> *)in_stack_ffffffffffffff40);
  }
  else {
    Kernel::Problem::clauseIterator(in_stack_ffffffffffffff68);
    Lib::VirtualIterator<Kernel::Clause_*>::operator=
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffff50,
               (VirtualIterator<Kernel::Clause_*> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffff40);
  }
  while( true ) {
    bVar1 = Lib::VirtualIterator<Kernel::Clause_*>::hasNext
                      ((VirtualIterator<Kernel::Clause_*> *)0xad06ac);
    in_stack_ffffffffffffff4c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
    if (!bVar1) break;
    in_stack_ffffffffffffff40 =
         Lib::VirtualIterator<Kernel::Clause_*>::next((VirtualIterator<Kernel::Clause_*> *)0xad06c9)
    ;
    addInputClause(in_stack_ffffffffffffff50,
                   (Clause *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  if (this->_splitter != (Splitter *)0x0) {
    Splitter::init(this->_splitter,(EVP_PKEY_CTX *)this);
  }
  if (this->_consFinder != (ConsequenceFinder *)0x0) {
    ConsequenceFinder::init(this->_consFinder,(EVP_PKEY_CTX *)this);
  }
  if (this->_symEl != (SymElOutput *)0x0) {
    SymElOutput::init(this->_symEl,(EVP_PKEY_CTX *)this);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)in_stack_ffffffffffffff40);
  return extraout_EAX;
}

Assistant:

void SaturationAlgorithm::init()
{
  ClauseIterator toAdd;

  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Stack<Clause *> aux;
    aux.loadFromIterator(_prb.clauseIterator());
    Shuffling::shuffleArray(aux,aux.size());
    toAdd = pvi(arrayIter(std::move(aux)));
  } else {
    toAdd = _prb.clauseIterator();
  }

  while (toAdd.hasNext()) {
    Clause* cl = toAdd.next();
    addInputClause(cl);
  }

  if (_splitter) {
    _splitter->init(this);
  }
  if (_consFinder) {
    _consFinder->init(this);
  }
  if (_symEl) {
    _symEl->init(this);
  }
}